

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Colour::SetMasteringMetadata(Colour *this,MasteringMetadata *mastering_metadata)

{
  bool bVar1;
  MasteringMetadata *this_00;
  pointer pMVar2;
  PrimaryChromaticity *r;
  PrimaryChromaticity *g;
  PrimaryChromaticity *b;
  PrimaryChromaticity *white_point;
  int iVar3;
  MasteringMetadata *pMVar4;
  void *extraout_RDX;
  char *in_R8;
  int in_R9D;
  float fVar5;
  int in_stack_ffffffffffffff48;
  pointer local_48;
  unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  local_28;
  unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_> mm_ptr;
  MasteringMetadata *mastering_metadata_local;
  Colour *this_local;
  
  mm_ptr._M_t.
  super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  ._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
        )(__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
          )mastering_metadata;
  this_00 = (MasteringMetadata *)operator_new(0x28,(nothrow_t *)&std::nothrow);
  local_48 = (pointer)0x0;
  pMVar4 = this_00;
  if (this_00 != (MasteringMetadata *)0x0) {
    MasteringMetadata::MasteringMetadata(this_00);
    local_48 = this_00;
  }
  iVar3 = (int)pMVar4;
  std::unique_ptr<mkvmuxer::MasteringMetadata,std::default_delete<mkvmuxer::MasteringMetadata>>::
  unique_ptr<std::default_delete<mkvmuxer::MasteringMetadata>,void>
            ((unique_ptr<mkvmuxer::MasteringMetadata,std::default_delete<mkvmuxer::MasteringMetadata>>
              *)&local_28,local_48);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar1) {
    pMVar2 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->(&local_28);
    fVar5 = MasteringMetadata::luminance_max
                      ((MasteringMetadata *)
                       mm_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    MasteringMetadata::set_luminance_max(pMVar2,fVar5);
    pMVar2 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->(&local_28);
    fVar5 = MasteringMetadata::luminance_min
                      ((MasteringMetadata *)
                       mm_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    MasteringMetadata::set_luminance_min(pMVar2,fVar5);
    pMVar2 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->(&local_28);
    MasteringMetadata::r
              ((MasteringMetadata *)
               mm_ptr._M_t.
               super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl,local_48,
               extraout_RDX,iVar3,in_R8,in_R9D,in_stack_ffffffffffffff48);
    g = MasteringMetadata::g
                  ((MasteringMetadata *)
                   mm_ptr._M_t.
                   super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    b = MasteringMetadata::b
                  ((MasteringMetadata *)
                   mm_ptr._M_t.
                   super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    white_point = MasteringMetadata::white_point
                            ((MasteringMetadata *)
                             mm_ptr._M_t.
                             super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                             .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>.
                             _M_head_impl);
    bVar1 = MasteringMetadata::SetChromaticity(pMVar2,r,g,b,white_point);
    if (bVar1) {
      pMVar4 = this->mastering_metadata_;
      if (pMVar4 != (MasteringMetadata *)0x0) {
        MasteringMetadata::~MasteringMetadata(pMVar4);
        operator_delete(pMVar4);
      }
      pMVar2 = std::
               unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               ::release(&local_28);
      this->mastering_metadata_ = pMVar2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>::
  ~unique_ptr(&local_28);
  return this_local._7_1_;
}

Assistant:

bool Colour::SetMasteringMetadata(const MasteringMetadata& mastering_metadata) {
  std::unique_ptr<MasteringMetadata> mm_ptr(new (std::nothrow)
                                                MasteringMetadata());
  if (!mm_ptr)
    return false;

  mm_ptr->set_luminance_max(mastering_metadata.luminance_max());
  mm_ptr->set_luminance_min(mastering_metadata.luminance_min());

  if (!mm_ptr->SetChromaticity(mastering_metadata.r(), mastering_metadata.g(),
                               mastering_metadata.b(),
                               mastering_metadata.white_point())) {
    return false;
  }

  delete mastering_metadata_;
  mastering_metadata_ = mm_ptr.release();
  return true;
}